

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::operator=
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *other)

{
  int64_t iVar1;
  
  if (this != other) {
    if (((~(byte)(this->field_0).json_ref_ & 0xc) == 0) ||
       ((~(byte)(other->field_0).json_ref_ & 0xc) == 0)) {
      swap(this,other);
    }
    else {
      iVar1 = (other->field_0).int64_.val_;
      *(undefined8 *)&this->field_0 = *(undefined8 *)&other->field_0;
      (this->field_0).int64_.val_ = iVar1;
    }
  }
  return this;
}

Assistant:

basic_json& operator=(basic_json&& other) noexcept
        {
            if (this != &other)
            {
                move_assignment(std::move(other));
            }
            return *this;
        }